

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> * __thiscall
testing::internal::
OnCallSpec<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>::GetAction
          (OnCallSpec<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *this
          )

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  FailureReporterInterface *pFVar4;
  long *local_48 [2];
  long local_38 [2];
  
  iVar1 = *(int *)(this + 0xc);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,".WillByDefault() must appear exactly once in an ON_CALL().","");
  if (iVar1 != 2) {
    uVar2 = *(uint *)(this + 8);
    uVar3 = *(undefined8 *)this;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,1,uVar3,(ulong)uVar2,local_48);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return (Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *)
         (this + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }